

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_unnest_expression.cpp
# Opt level: O2

string * __thiscall
duckdb::BoundUnnestExpression::ToString_abi_cxx11_
          (string *__return_storage_ptr__,BoundUnnestExpression *this)

{
  pointer pEVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (&this->child);
  (*(pEVar1->super_BaseExpression)._vptr_BaseExpression[8])(&local_30,pEVar1);
  ::std::operator+(&local_50,"UNNEST(",&local_30);
  ::std::operator+(__return_storage_ptr__,&local_50,")");
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string BoundUnnestExpression::ToString() const {
	return "UNNEST(" + child->ToString() + ")";
}